

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O0

void __thiscall
addrman_tests::caddrinfo_get_tried_bucket_legacy::test_method
          (caddrinfo_get_tried_bucket_legacy *this)

{
  bool bVar1;
  undefined1 uVar2;
  string *ip;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar3;
  int bucket_1;
  int j;
  int bucket;
  int i;
  AddrInfo infoj;
  AddrInfo infoi;
  set<int,_std::less<int>,_std::allocator<int>_> buckets;
  AddrInfo info2;
  uint256 nKey2;
  uint256 nKey1;
  AddrInfo info1;
  CNetAddr source1;
  CAddress addr2;
  CAddress addr1;
  char *in_stack_fffffffffffff508;
  lazy_ostream *in_stack_fffffffffffff510;
  char *in_stack_fffffffffffff518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff520;
  HashWriter *in_stack_fffffffffffff528;
  undefined7 in_stack_fffffffffffff530;
  undefined1 in_stack_fffffffffffff537;
  CAddress *in_stack_fffffffffffff538;
  const_string *in_stack_fffffffffffff540;
  CAddress *pCVar4;
  undefined7 in_stack_fffffffffffff548;
  undefined1 in_stack_fffffffffffff54f;
  char *in_stack_fffffffffffff550;
  int in_stack_fffffffffffff558;
  undefined4 in_stack_fffffffffffff55c;
  string *in_stack_fffffffffffff560;
  CAddress *in_stack_fffffffffffff568;
  CAddress *addrIn;
  undefined7 in_stack_fffffffffffff570;
  undefined1 in_stack_fffffffffffff577;
  int in_stack_fffffffffffff590;
  int in_stack_fffffffffffff594;
  uint256 *in_stack_fffffffffffff598;
  CAddress *nKey;
  undefined7 in_stack_fffffffffffff5a0;
  undefined1 in_stack_fffffffffffff5a7;
  undefined8 in_stack_fffffffffffff5f0;
  uint16_t port;
  size_type local_9c0;
  undefined1 local_9b8 [16];
  undefined1 local_9a8 [68];
  int local_964;
  int iVar5;
  size_type local_958;
  undefined1 local_950 [16];
  undefined1 local_940 [64];
  int local_900;
  int local_8fc;
  const_string local_8f8 [2];
  lazy_ostream local_8d8 [2];
  assertion_result local_8b8 [2];
  const_string local_880 [2];
  lazy_ostream local_860 [5];
  assertion_result local_810 [2];
  const_string local_7d8 [2];
  lazy_ostream local_7b8 [2];
  assertion_result local_798 [2];
  lazy_ostream local_760;
  undefined1 local_748 [68];
  undefined4 local_704;
  undefined4 local_700;
  allocator<char> local_6fb;
  allocator<char> local_6fa;
  allocator<char> local_6f9;
  _Base_ptr local_6f8;
  undefined1 local_6f0;
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  long local_8;
  
  port = (uint16_t)((ulong)in_stack_fffffffffffff5f0 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),in_stack_fffffffffffff550
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
  ResolveService((string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),port);
  CAddress::CAddress(in_stack_fffffffffffff538,
                     (CService *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     (ServiceFlags)in_stack_fffffffffffff528);
  CService::~CService((CService *)in_stack_fffffffffffff508);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::allocator<char>::~allocator(&local_6f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),in_stack_fffffffffffff550
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
  ResolveService((string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),port);
  CAddress::CAddress(in_stack_fffffffffffff538,
                     (CService *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                     (ServiceFlags)in_stack_fffffffffffff528);
  CService::~CService((CService *)in_stack_fffffffffffff508);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::allocator<char>::~allocator(&local_6fa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),in_stack_fffffffffffff550
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548));
  ResolveIP(in_stack_fffffffffffff560);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff508);
  std::allocator<char>::~allocator(&local_6fb);
  AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     in_stack_fffffffffffff568,(CNetAddr *)in_stack_fffffffffffff560);
  local_208 = 0;
  uStack_200 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_238 = 0;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_258 = 0;
  uStack_250 = 0;
  local_1f8 = 0;
  HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffff508);
  local_700 = 1;
  HashWriter::operator<<((HashWriter *)in_stack_fffffffffffff518,(int *)in_stack_fffffffffffff510);
  HashWriter::GetHash(in_stack_fffffffffffff528);
  local_298 = 0;
  uStack_290 = 0;
  local_2a8 = 0;
  uStack_2a0 = 0;
  local_2b8 = 0;
  uStack_2b0 = 0;
  local_2c8 = 0;
  uStack_2c0 = 0;
  local_2d8 = 0;
  uStack_2d0 = 0;
  local_2e8 = 0;
  uStack_2e0 = 0;
  local_288 = 0;
  HashWriter::HashWriter((HashWriter *)in_stack_fffffffffffff508);
  local_704 = 2;
  HashWriter::operator<<((HashWriter *)in_stack_fffffffffffff518,(int *)in_stack_fffffffffffff510);
  HashWriter::GetHash(in_stack_fffffffffffff528);
  do {
    pCVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               in_stack_fffffffffffff540,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff510,(char (*) [1])in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    local_760._vptr_lazy_ostream._4_4_ =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
                    in_stack_fffffffffffff598,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590)
                   );
    local_760._vptr_lazy_ostream._0_4_ = 0x28;
    in_stack_fffffffffffff518 = "40";
    in_stack_fffffffffffff510 = &local_760;
    in_stack_fffffffffffff508 = "info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN)";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (local_748,&local_760.m_empty,0x1d6,1,2,
               (undefined1 *)((long)&local_760._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff508);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               in_stack_fffffffffffff540,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    AddrInfo::GetTriedBucket
              ((AddrInfo *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
               in_stack_fffffffffffff598,
               (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    AddrInfo::GetTriedBucket
              ((AddrInfo *)CONCAT17(in_stack_fffffffffffff5a7,in_stack_fffffffffffff5a0),
               in_stack_fffffffffffff598,
               (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff518,
               SUB81((ulong)in_stack_fffffffffffff510 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff510,(basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    in_stack_fffffffffffff508 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_798,local_7b8,local_7d8,0x1da,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff508);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                     in_stack_fffffffffffff568,(CNetAddr *)in_stack_fffffffffffff560);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               in_stack_fffffffffffff540,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    CService::GetKey(&in_stack_fffffffffffff538->super_CService);
    CService::GetKey(&in_stack_fffffffffffff538->super_CService);
    std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    in_stack_fffffffffffff538,
                    (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                    CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff518,
               SUB81((ulong)in_stack_fffffffffffff510 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff510,(basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    in_stack_fffffffffffff508 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_810,local_860,local_880,0x1e0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff508);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff518);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff518);
    uVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar2);
  do {
    nKey = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               in_stack_fffffffffffff540,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    in_stack_fffffffffffff594 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff5a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590)
                   );
    in_stack_fffffffffffff590 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff5a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590)
                   );
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff518,
               SUB81((ulong)in_stack_fffffffffffff510 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::operator<<
              (in_stack_fffffffffffff510,(basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    in_stack_fffffffffffff508 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8d8,local_8f8,0x1e1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff508);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff508);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff508);
  for (local_8fc = 0; local_8fc < 0xff; local_8fc = local_8fc + 1) {
    util::ToString<int>((int *)in_stack_fffffffffffff540);
    std::operator+((char *)in_stack_fffffffffffff520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff518);
    ResolveService((string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                   (uint16_t)((ulong)pCVar4 >> 0x30));
    CAddress::CAddress(in_stack_fffffffffffff538,
                       (CService *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       (ServiceFlags)in_stack_fffffffffffff528);
    util::ToString<int>((int *)in_stack_fffffffffffff540);
    std::operator+((char *)in_stack_fffffffffffff520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff518);
    ResolveIP(in_stack_fffffffffffff560);
    AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       in_stack_fffffffffffff568,(CNetAddr *)in_stack_fffffffffffff560);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    CAddress::~CAddress((CAddress *)in_stack_fffffffffffff508);
    CService::~CService((CService *)in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    local_900 = AddrInfo::GetTriedBucket
                          ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff5a0),(uint256 *)nKey,
                           (NetGroupManager *)
                           CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590));
    pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff518,
                       (value_type_conflict2 *)in_stack_fffffffffffff510);
    local_6e8 = (_Base_ptr)pVar3.first._M_node;
    in_stack_fffffffffffff577 = pVar3.second;
    local_6e0 = in_stack_fffffffffffff577;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff508);
  }
  do {
    addrIn = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               in_stack_fffffffffffff540,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    ip = (string *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff510,(char (*) [1])in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    local_958 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffff508);
    in_stack_fffffffffffff518 = "8U";
    in_stack_fffffffffffff510 = (lazy_ostream *)&stack0xfffffffffffff6a4;
    in_stack_fffffffffffff508 = "buckets.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_940,local_950,0x1ed,1,2,&local_958);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff508);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff55c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff55c);
  } while (bVar1);
  std::set<int,_std::less<int>,_std::allocator<int>_>::clear
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff508);
  for (iVar5 = 0; iVar5 < 0xff; iVar5 = iVar5 + 1) {
    util::ToString<int>((int *)in_stack_fffffffffffff540);
    std::operator+((char *)in_stack_fffffffffffff520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff518);
    std::operator+(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    ResolveService((string *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558),
                   (uint16_t)((ulong)pCVar4 >> 0x30));
    CAddress::CAddress(in_stack_fffffffffffff538,
                       (CService *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530),
                       (ServiceFlags)in_stack_fffffffffffff528);
    util::ToString<int>((int *)in_stack_fffffffffffff540);
    std::operator+((char *)in_stack_fffffffffffff520,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff518);
    std::operator+(in_stack_fffffffffffff520,in_stack_fffffffffffff518);
    ResolveIP(ip);
    AddrInfo::AddrInfo((AddrInfo *)CONCAT17(in_stack_fffffffffffff577,in_stack_fffffffffffff570),
                       addrIn,(CNetAddr *)ip);
    CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    CAddress::~CAddress((CAddress *)in_stack_fffffffffffff508);
    CService::~CService((CService *)in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff508);
    in_stack_fffffffffffff558 =
         AddrInfo::GetTriedBucket
                   ((AddrInfo *)CONCAT17(uVar2,in_stack_fffffffffffff5a0),(uint256 *)nKey,
                    (NetGroupManager *)CONCAT44(in_stack_fffffffffffff594,in_stack_fffffffffffff590)
                   );
    local_964 = in_stack_fffffffffffff558;
    pVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff518,
                       (value_type_conflict2 *)in_stack_fffffffffffff510);
    local_6f8 = (_Base_ptr)pVar3.first._M_node;
    in_stack_fffffffffffff54f = pVar3.second;
    local_6f0 = in_stack_fffffffffffff54f;
    AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff508);
  }
  do {
    pCVar4 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff508);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffff54f,in_stack_fffffffffffff548),
               (const_string *)pCVar4,(size_t)in_stack_fffffffffffff538,
               (const_string *)CONCAT17(in_stack_fffffffffffff537,in_stack_fffffffffffff530));
    in_stack_fffffffffffff538 = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff510,(char (*) [1])in_stack_fffffffffffff508);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff518,
               (pointer)in_stack_fffffffffffff510,(unsigned_long)in_stack_fffffffffffff508);
    local_9c0 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)
                           in_stack_fffffffffffff508);
    in_stack_fffffffffffff518 = "160U";
    in_stack_fffffffffffff510 = (lazy_ostream *)&stack0xfffffffffffff63c;
    in_stack_fffffffffffff508 = "buckets.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_9a8,local_9b8,0x1f9,1,2,&local_9c0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff508);
    in_stack_fffffffffffff537 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff537);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff508);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff508);
  AddrInfo::~AddrInfo((AddrInfo *)in_stack_fffffffffffff508);
  CNetAddr::~CNetAddr((CNetAddr *)in_stack_fffffffffffff508);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff508);
  CAddress::~CAddress((CAddress *)in_stack_fffffffffffff508);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(caddrinfo_get_tried_bucket_legacy)
{
    CAddress addr1 = CAddress(ResolveService("250.1.1.1", 8333), NODE_NONE);
    CAddress addr2 = CAddress(ResolveService("250.1.1.1", 9999), NODE_NONE);

    CNetAddr source1 = ResolveIP("250.1.1.1");


    AddrInfo info1 = AddrInfo(addr1, source1);

    uint256 nKey1 = (HashWriter{} << 1).GetHash();
    uint256 nKey2 = (HashWriter{} << 2).GetHash();

    BOOST_CHECK_EQUAL(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN), 40);

    // Test: Make sure key actually randomizes bucket placement. A fail on
    //  this test could be a security issue.
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info1.GetTriedBucket(nKey2, EMPTY_NETGROUPMAN));

    // Test: Two addresses with same IP but different ports can map to
    //  different buckets because they have different keys.
    AddrInfo info2 = AddrInfo(addr2, source1);

    BOOST_CHECK(info1.GetKey() != info2.GetKey());
    BOOST_CHECK(info1.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN) != info2.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN));

    std::set<int> buckets;
    for (int i = 0; i < 255; i++) {
        AddrInfo infoi = AddrInfo(
            CAddress(ResolveService("250.1.1." + ToString(i)), NODE_NONE),
            ResolveIP("250.1.1." + ToString(i)));
        int bucket = infoi.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the same /16 prefix should
    // never get more than 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 8U);

    buckets.clear();
    for (int j = 0; j < 255; j++) {
        AddrInfo infoj = AddrInfo(
            CAddress(ResolveService("250." + ToString(j) + ".1.1"), NODE_NONE),
            ResolveIP("250." + ToString(j) + ".1.1"));
        int bucket = infoj.GetTriedBucket(nKey1, EMPTY_NETGROUPMAN);
        buckets.insert(bucket);
    }
    // Test: IP addresses in the different /16 prefix should map to more than
    // 8 buckets with legacy grouping
    BOOST_CHECK_EQUAL(buckets.size(), 160U);
}